

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O1

int lconnect(lua_State *L)

{
  int __fd;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *__cp;
  ulong uVar4;
  sockaddr_in my_addr;
  sockaddr local_38;
  
  iVar3 = 1;
  __cp = luaL_checklstring(L,1,(size_t *)0x0);
  uVar4 = luaL_checkinteger(L,2);
  __fd = socket(2,1,0);
  local_38.sa_data._2_4_ = inet_addr(__cp);
  local_38.sa_family = 2;
  local_38.sa_data._0_2_ = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
  iVar1 = connect(__fd,&local_38,0x10);
  if (iVar1 == -1) {
    iVar3 = luaL_error(L,"Connect %s %d failed",__cp,uVar4 & 0xffffffff);
  }
  else {
    uVar2 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar2 | 0x800));
    lua_pushinteger(L,(long)__fd);
  }
  return iVar3;
}

Assistant:

static int
lconnect(lua_State *L) {
	const char * addr = luaL_checkstring(L, 1);
	int port = luaL_checkinteger(L, 2);
	int fd = socket(AF_INET,SOCK_STREAM,0);
	struct sockaddr_in my_addr;

	my_addr.sin_addr.s_addr=inet_addr(addr);
	my_addr.sin_family=AF_INET;
	my_addr.sin_port=htons(port);

	int r = connect(fd,(struct sockaddr *)&my_addr,sizeof(struct sockaddr_in));

	if (r == -1) {
		return luaL_error(L, "Connect %s %d failed", addr, port);
	}

	int flag = fcntl(fd, F_GETFL, 0);
	fcntl(fd, F_SETFL, flag | O_NONBLOCK);

	lua_pushinteger(L, fd);

	return 1;
}